

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_block.cpp
# Opt level: O0

void __thiscall
spvtools::val::BasicBlock::DominatorIterator::DominatorIterator
          (DominatorIterator *this,BasicBlock *block,
          function<const_spvtools::val::BasicBlock_*(const_spvtools::val::BasicBlock_*)>
          *dominator_func)

{
  function<const_spvtools::val::BasicBlock_*(const_spvtools::val::BasicBlock_*)>
  *dominator_func_local;
  BasicBlock *block_local;
  DominatorIterator *this_local;
  
  this->current_ = block;
  std::function<const_spvtools::val::BasicBlock_*(const_spvtools::val::BasicBlock_*)>::function
            (&this->dom_func_,dominator_func);
  return;
}

Assistant:

BasicBlock::DominatorIterator::DominatorIterator(
    const BasicBlock* block,
    std::function<const BasicBlock*(const BasicBlock*)> dominator_func)
    : current_(block), dom_func_(dominator_func) {}